

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1224::run(TestCase1224 *this)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  uint i;
  uint uVar4;
  Orphanage OVar5;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar6;
  uint local_1c0;
  ListElementCount local_1bc;
  DebugComparison<int,_unsigned_int> _kjCondition_2;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> builder;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  OVar5 = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  OrphanBuilder::initList((OrphanBuilder *)&reader,OVar5.arena,OVar5.capTable,7,FOUR_BYTES);
  orphan.builder.capTable = (CapTableBuilder *)reader.reader.ptr;
  orphan.builder.location = (word *)reader.reader._24_8_;
  orphan.builder.segment = (SegmentBuilder *)reader.reader.capTable;
  OrphanBuilder::asList(&builder.builder,&orphan.builder,FOUR_BYTES);
  lVar2 = -7;
  uVar3 = 0;
  do {
    *(int *)(builder.builder.ptr + (uVar3 >> 3)) = (int)lVar2 + 0x75bcd1c;
    uVar3 = uVar3 + builder.builder.step;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  AVar6 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  reader.reader.capTable = (CapTableReader *)(AVar6.ptr)->size_;
  reader.reader.segment._0_4_ = 5;
  reader.reader.ptr = " == ";
  reader.reader.elementCount = 5;
  reader.reader.step = 0;
  reader.reader.structDataSize._0_1_ = reader.reader.capTable == (CapTableReader *)&DAT_00000005;
  if ((!(bool)(undefined1)reader.reader.structDataSize) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 5;
    AVar6 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    _kjCondition_2._0_8_ = (AVar6.ptr)->size_;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4d0,ERROR,
               "\"failed: expected \" \"(5) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 5, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (5) == (message.getSegmentsForOutput()[0].size())",
               (DebugComparison<int,_unsigned_long> *)&reader,(int *)&local_1c0,
               (unsigned_long *)&_kjCondition_2);
  }
  OrphanBuilder::truncate(&orphan.builder,(char *)0xb,4);
  AVar6 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  reader.reader.capTable = (CapTableReader *)(AVar6.ptr)->size_;
  reader.reader.segment._0_4_ = 7;
  reader.reader.ptr = " == ";
  reader.reader.elementCount = 5;
  reader.reader.step = 0;
  reader.reader.structDataSize._0_1_ = reader.reader.capTable == (CapTableReader *)&DAT_00000007;
  if ((!(bool)(undefined1)reader.reader.structDataSize) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 7;
    AVar6 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    _kjCondition_2._0_8_ = (AVar6.ptr)->size_;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4d2,ERROR,
               "\"failed: expected \" \"(7) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 7, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (7) == (message.getSegmentsForOutput()[0].size())",
               (DebugComparison<int,_unsigned_long> *)&reader,(int *)&local_1c0,
               (unsigned_long *)&_kjCondition_2);
  }
  OrphanBuilder::asListReader(&reader.reader,&orphan.builder,FOUR_BYTES);
  _kjCondition_2.right = reader.reader.elementCount;
  _kjCondition_2.left = 0xb;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  _kjCondition_2.result = reader.reader.elementCount == 0xb;
  if ((!_kjCondition_2.result) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 0xb;
    local_1bc = reader.reader.elementCount;
    kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4d5,ERROR,
               "\"failed: expected \" \"(11) == (reader.size())\", _kjCondition, 11, reader.size()",
               (char (*) [41])"failed: expected (11) == (reader.size())",&_kjCondition_2,
               (int *)&local_1c0,&local_1bc);
  }
  uVar3 = 0x75bcd15;
  do {
    uVar1 = ((ulong)reader.reader._24_8_ >> 0x20) * (uVar3 - 0x75bcd15) >> 3;
    uVar4 = (uint)uVar3;
    _kjCondition_2.right = *(uint *)(reader.reader.ptr + uVar1);
    _kjCondition_2.left = uVar4;
    _kjCondition_2.op.content.ptr = " == ";
    _kjCondition_2.op.content.size_ = 5;
    _kjCondition_2.result = uVar3 == *(uint *)(reader.reader.ptr + uVar1);
    if ((!_kjCondition_2.result) && (kj::_::Debug::minSeverity < 3)) {
      local_1bc = *(ListElementCount *)(reader.reader.ptr + uVar1);
      local_1c0 = uVar4;
      kj::_::Debug::
      log<char_const(&)[48],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4d8,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (reader[i])\", _kjCondition, 123456789 + i, reader[i]"
                 ,(char (*) [48])"failed: expected (123456789 + i) == (reader[i])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_2,&local_1c0,
                 &local_1bc);
    }
    uVar1 = (uVar3 - 0x75bcd15) * (ulong)builder.builder.step >> 3;
    _kjCondition_2.right = *(uint *)(builder.builder.ptr + uVar1);
    _kjCondition_2.op.content.ptr = " == ";
    _kjCondition_2.op.content.size_ = 5;
    _kjCondition_2.result = uVar3 == *(uint *)(builder.builder.ptr + uVar1);
    if ((!_kjCondition_2.result) && (kj::_::Debug::minSeverity < 3)) {
      local_1bc = *(ListElementCount *)(builder.builder.ptr + uVar1);
      local_1c0 = uVar4;
      kj::_::Debug::
      log<char_const(&)[49],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4d9,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (builder[i])\", _kjCondition, 123456789 + i, builder[i]"
                 ,(char (*) [49])"failed: expected (123456789 + i) == (builder[i])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_2,&local_1c0,
                 &local_1bc);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x75bcd1c);
  lVar2 = 7;
  do {
    uVar3 = ((ulong)reader.reader._24_8_ >> 0x20) * lVar2 >> 3;
    _kjCondition_2._0_8_ = (ulong)*(uint *)(reader.reader.ptr + uVar3) << 0x20;
    _kjCondition_2.op.content.ptr = " == ";
    _kjCondition_2.op.content.size_ = 5;
    _kjCondition_2.result = *(uint *)(reader.reader.ptr + uVar3) == 0;
    if ((!_kjCondition_2.result) && (kj::_::Debug::minSeverity < 3)) {
      local_1c0 = 0;
      local_1bc = *(ListElementCount *)(reader.reader.ptr + uVar3);
      kj::_::Debug::
      log<char_const(&)[36],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4dc,ERROR,
                 "\"failed: expected \" \"(0) == (reader[i])\", _kjCondition, 0, reader[i]",
                 (char (*) [36])"failed: expected (0) == (reader[i])",&_kjCondition_2,
                 (int *)&local_1c0,&local_1bc);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xb);
  builder.builder.ptr[0] = 'A';
  builder.builder.ptr[1] = '\x01';
  builder.builder.ptr[2] = '\0';
  builder.builder.ptr[3] = '\0';
  _kjCondition_2.right = *(uint *)reader.reader.ptr;
  _kjCondition_2.left = 0x141;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  _kjCondition_2.result = *(uint *)reader.reader.ptr == 0x141;
  if ((!_kjCondition_2.result) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 0x141;
    local_1bc = *(ListElementCount *)reader.reader.ptr;
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4e2,ERROR,
               "\"failed: expected \" \"(321) == (reader[0])\", _kjCondition, 321, reader[0]",
               (char (*) [38])"failed: expected (321) == (reader[0])",&_kjCondition_2,
               (int *)&local_1c0,&local_1bc);
  }
  if (orphan.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&orphan.builder);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ExtendPrimitiveList) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<List<uint32_t>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.set(i, 123456789 + i);
  }

  EXPECT_EQ(5, message.getSegmentsForOutput()[0].size());
  orphan.truncate(11);
  EXPECT_EQ(7, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(123456789 + i, reader[i]);
    EXPECT_EQ(123456789 + i, builder[i]);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_EQ(0, reader[i]);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, 321);
  EXPECT_EQ(321, reader[0]);
}